

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O2

void __thiscall
chaiscript::parser::ChaiScript_Parser::
Char_Parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
process_hex(Char_Parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *this)

{
  std::__cxx11::stoll(&this->hex_matches,(size_t *)0x0,0x10);
  std::__cxx11::string::push_back((char)this->match);
  (this->hex_matches)._M_string_length = 0;
  *(this->hex_matches)._M_dataplus._M_p = '\0';
  this->is_escaped = false;
  this->is_hex = false;
  return;
}

Assistant:

void process_hex()
        {
          auto val = stoll(hex_matches, 0, 16);
          match.push_back(char_type(val));
          hex_matches.clear();
          is_escaped = false;
          is_hex = false;
        }